

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::SummaryTest_quantile_values_Test::TestBody
          (SummaryTest_quantile_values_Test *this)

{
  pointer pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  expr1;
  undefined8 uVar2;
  pointer *__ptr;
  int i;
  int iVar3;
  char *pcVar4;
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  AssertionResult gtest_ar;
  Summary s;
  ClientMetric metric;
  Summary summary;
  uint uVar5;
  undefined4 in_stack_fffffffffffffe94;
  allocator_type in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffe99;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffea0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  val1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  val1_00;
  pointer in_stack_fffffffffffffea8;
  pointer abs_error_expr;
  vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  local_148;
  undefined1 local_128 [48];
  pointer local_f8;
  Quantile local_e8;
  pointer local_c0;
  Summary local_98;
  
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)local_128,0.5,0.05);
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)(local_128 + 0x20),0.9,0.01);
  detail::CKMSQuantiles::Quantile::Quantile(&local_e8,0.99,0.001);
  __l._M_len = 3;
  __l._M_array = (Quantile *)local_128;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector((vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
            *)&stack0xfffffffffffffea8,__l,(allocator_type *)&stack0xfffffffffffffe98);
  Summary::Summary(&local_98,(Quantiles *)&stack0xfffffffffffffea8,(milliseconds)0x36ee80,5);
  if (in_stack_fffffffffffffea8 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffea8);
  }
  iVar3 = 1;
  do {
    Summary::Observe(&local_98,(double)iVar3);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x186a1);
  Summary::Collect((ClientMetric *)local_128,&local_98);
  std::
  vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>::
  vector(&local_148,
         (vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
          *)&local_e8);
  expr1._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_148.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  uVar5 = 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&stack0xfffffffffffffe98,"s.quantile.size()","3U",
             (unsigned_long *)&stack0xfffffffffffffe88,(uint *)&stack0xfffffffffffffe90);
  if (in_stack_fffffffffffffe98 == (allocator_type)0x0) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe88);
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_fffffffffffffea0._M_head_impl ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((in_stack_fffffffffffffea0._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
               ,0x43,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe90,(Message *)&stack0xfffffffffffffe88);
LAB_0013b157:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
    if (expr1._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)expr1._M_head_impl + 8))();
    }
LAB_0013b170:
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_fffffffffffffea0._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar1 = ((in_stack_fffffffffffffea0._M_head_impl)->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &(in_stack_fffffffffffffea0._M_head_impl)->field_2) {
        operator_delete(pcVar1);
      }
      operator_delete(in_stack_fffffffffffffea0._M_head_impl);
    }
    if ((pointer)local_148.
                 super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.
                      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c0 != (pointer)0x0) {
      operator_delete(local_c0);
    }
    if ((pointer)local_e8.quantile != (pointer)0x0) {
      operator_delete((void *)local_e8.quantile);
    }
    std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
    ~vector((vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             *)local_128);
    std::
    vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>::
    ~vector(&local_98.quantile_values_.ckms_quantiles_);
    if (local_98.quantiles_.
        super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.quantiles_.
                      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  val1._M_head_impl = in_stack_fffffffffffffea0._M_head_impl;
  abs_error_expr = local_f8;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )in_stack_fffffffffffffea0._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)in_stack_fffffffffffffea0._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)in_stack_fffffffffffffea0._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)in_stack_fffffffffffffea0._M_head_impl);
      abs_error_expr = local_f8;
    }
    operator_delete(in_stack_fffffffffffffea0._M_head_impl);
  }
  if (local_148.
      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_148.
      super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    testing::internal::DoubleNearPredFormat
              ((char *)expr1._M_head_impl,(char *)0x13af0b,(char *)abs_error_expr,
               (double)val1._M_head_impl,
               (double)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98),
               (double)CONCAT44(in_stack_fffffffffffffe94,uVar5));
    if (in_stack_fffffffffffffe98 == (allocator_type)0x0) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe88);
      if (val1._M_head_impl ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((val1._M_head_impl)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
                 ,0x45,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe90,(Message *)&stack0xfffffffffffffe88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
      if (expr1._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)expr1._M_head_impl + 8))();
      }
    }
    val1_00._M_head_impl = val1._M_head_impl;
    if (val1._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((val1._M_head_impl)->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &(val1._M_head_impl)->field_2) {
        operator_delete(pcVar1);
      }
      operator_delete(val1._M_head_impl);
    }
    if (1 < (ulong)((long)local_148.
                          super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_148.
                          super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      testing::internal::DoubleNearPredFormat
                ((char *)expr1._M_head_impl,(char *)0x13b032,(char *)abs_error_expr,
                 (double)val1_00._M_head_impl,
                 (double)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98),
                 (double)CONCAT44(in_stack_fffffffffffffe94,uVar5));
      if (in_stack_fffffffffffffe98 == (allocator_type)0x0) {
        testing::Message::Message((Message *)&stack0xfffffffffffffe88);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )val1_00._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)val1_00._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
                   ,0x46,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe90,(Message *)&stack0xfffffffffffffe88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )expr1._M_head_impl !=
            (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )0x0) {
          (**(code **)(*(long *)expr1._M_head_impl + 8))();
        }
      }
      in_stack_fffffffffffffea0._M_head_impl = val1_00._M_head_impl;
      if (val1_00._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(undefined8 **)val1_00._M_head_impl !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)val1_00._M_head_impl + 0x10)) {
          operator_delete(*(undefined8 **)val1_00._M_head_impl);
        }
        operator_delete(val1_00._M_head_impl);
      }
      if ((ulong)((long)local_148.
                        super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_148.
                        super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) < 3) goto LAB_0013b21d;
      testing::internal::DoubleNearPredFormat
                ((char *)expr1._M_head_impl,(char *)0x13b10a,(char *)abs_error_expr,
                 (double)in_stack_fffffffffffffea0._M_head_impl,
                 (double)CONCAT71(in_stack_fffffffffffffe99,in_stack_fffffffffffffe98),
                 (double)CONCAT44(in_stack_fffffffffffffe94,uVar5));
      if (in_stack_fffffffffffffe98 != (allocator_type)0x0) goto LAB_0013b170;
      testing::Message::Message((Message *)&stack0xfffffffffffffe88);
      if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )in_stack_fffffffffffffea0._M_head_impl ==
          (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((in_stack_fffffffffffffea0._M_head_impl)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/summary_test.cc"
                 ,0x47,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe90,(Message *)&stack0xfffffffffffffe88);
      goto LAB_0013b157;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0013b21d:
  uVar2 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )expr1._M_head_impl !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    (**(code **)(*(long *)expr1._M_head_impl + 8))();
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&stack0xfffffffffffffe98);
  if ((pointer)local_148.
               super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ClientMetric::~ClientMetric((ClientMetric *)local_128);
  Summary::~Summary(&local_98);
  _Unwind_Resume(uVar2);
}

Assistant:

TEST(SummaryTest, quantile_values) {
  static const int SAMPLES = 100000;

  Summary summary{Summary::Quantiles{{0.5, 0.05}, {0.9, 0.01}, {0.99, 0.001}},
                  std::chrono::hours{1}};  // prevent rotation on slow CPUs
  for (int i = 1; i <= SAMPLES; ++i) summary.Observe(i);

  auto metric = summary.Collect();
  auto s = metric.summary;
  ASSERT_EQ(s.quantile.size(), 3U);

  EXPECT_NEAR(s.quantile.at(0).value, 0.5 * SAMPLES, 0.05 * SAMPLES);
  EXPECT_NEAR(s.quantile.at(1).value, 0.9 * SAMPLES, 0.01 * SAMPLES);
  EXPECT_NEAR(s.quantile.at(2).value, 0.99 * SAMPLES, 0.001 * SAMPLES);
}